

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cxx
# Opt level: O1

char * __thiscall cmsys::RegExpCompile::reg(RegExpCompile *this,int paren,int *flagp)

{
  int iVar1;
  ushort uVar2;
  ulong in_RAX;
  char *val;
  char *pcVar3;
  char cVar4;
  char *pcVar5;
  int flags;
  undefined8 uStack_38;
  
  *flagp = 1;
  if (paren == 0) {
    cVar4 = '\0';
    pcVar3 = (char *)0x0;
  }
  else {
    iVar1 = this->regnpar;
    if (9 < iVar1) {
      pcVar3 = "RegularExpression::compile(): Too many parentheses.";
      goto LAB_003db1e9;
    }
    this->regnpar = iVar1 + 1;
    pcVar3 = this->regcode;
    if (pcVar3 == &regdummy) {
      this->regsize = this->regsize + 3;
    }
    else {
      *pcVar3 = (char)iVar1 + '\x14';
      pcVar3[1] = '\0';
      pcVar3[2] = '\0';
      this->regcode = pcVar3 + 3;
    }
    cVar4 = (char)iVar1 + '\x1e';
  }
  uStack_38 = in_RAX;
  val = regbranch(this,(int *)((long)&uStack_38 + 4));
  if (val == (char *)0x0) {
    return (char *)0x0;
  }
  if (pcVar3 != (char *)0x0) {
    regtail(pcVar3,val);
    val = pcVar3;
  }
  if ((uStack_38 & 0x100000000) == 0) {
    *(byte *)flagp = (byte)*flagp & 0xfe;
  }
  *flagp = *flagp | uStack_38._4_4_ & 4;
  pcVar3 = this->regparse;
  if (*pcVar3 == '|') {
    do {
      this->regparse = pcVar3 + 1;
      pcVar3 = regbranch(this,(int *)((long)&uStack_38 + 4));
      if (pcVar3 == (char *)0x0) {
        return (char *)0x0;
      }
      regtail(val,pcVar3);
      if ((uStack_38 & 0x100000000) == 0) {
        *(byte *)flagp = (byte)*flagp & 0xfe;
      }
      *flagp = *flagp | uStack_38._4_4_ & 4;
      pcVar3 = this->regparse;
    } while (*pcVar3 == '|');
  }
  pcVar3 = this->regcode;
  if (pcVar3 == &regdummy) {
    this->regsize = this->regsize + 3;
  }
  else {
    *pcVar3 = cVar4;
    pcVar3[1] = '\0';
    pcVar3[2] = '\0';
    this->regcode = pcVar3 + 3;
  }
  regtail(val,pcVar3);
  pcVar5 = val;
  do {
    if (pcVar5 == &regdummy) {
LAB_003db1a9:
      pcVar5 = (char *)0x0;
    }
    else {
      if (*pcVar5 == '\x06') {
        regtail(pcVar5 + 3,pcVar3);
      }
      if ((pcVar5 == &regdummy) ||
         (uVar2 = *(ushort *)(pcVar5 + 1) << 8 | *(ushort *)(pcVar5 + 1) >> 8, uVar2 == 0))
      goto LAB_003db1a9;
      if (*pcVar5 == '\a') {
        pcVar5 = pcVar5 + -(ulong)uVar2;
      }
      else {
        pcVar5 = pcVar5 + uVar2;
      }
    }
  } while (pcVar5 != (char *)0x0);
  pcVar3 = this->regparse;
  if (paren == 0) {
    if (*pcVar3 == '\0') {
      return val;
    }
    if (*pcVar3 != ')') {
      pcVar3 = "RegularExpression::compile(): Internal error.";
      goto LAB_003db1e9;
    }
  }
  else {
    this->regparse = pcVar3 + 1;
    if (*pcVar3 == ')') {
      return val;
    }
  }
  pcVar3 = "RegularExpression::compile(): Unmatched parentheses.";
LAB_003db1e9:
  puts(pcVar3);
  return (char *)0x0;
}

Assistant:

char* RegExpCompile::reg(int paren, int* flagp)
{
  char* ret;
  char* br;
  char* ender;
  int parno = 0;
  int flags;

  *flagp = HASWIDTH; // Tentatively.

  // Make an OPEN node, if parenthesized.
  if (paren) {
    if (regnpar >= RegularExpressionMatch::NSUBEXP) {
      // RAISE Error, SYM(RegularExpression), SYM(Too_Many_Parens),
      printf("RegularExpression::compile(): Too many parentheses.\n");
      return KWSYS_NULLPTR;
    }
    parno = regnpar;
    regnpar++;
    ret = regnode(static_cast<char>(OPEN + parno));
  } else
    ret = KWSYS_NULLPTR;

  // Pick up the branches, linking them together.
  br = regbranch(&flags);
  if (br == KWSYS_NULLPTR)
    return (KWSYS_NULLPTR);
  if (ret != KWSYS_NULLPTR)
    regtail(ret, br); // OPEN -> first.
  else
    ret = br;
  if (!(flags & HASWIDTH))
    *flagp &= ~HASWIDTH;
  *flagp |= flags & SPSTART;
  while (*regparse == '|') {
    regparse++;
    br = regbranch(&flags);
    if (br == KWSYS_NULLPTR)
      return (KWSYS_NULLPTR);
    regtail(ret, br); // BRANCH -> BRANCH.
    if (!(flags & HASWIDTH))
      *flagp &= ~HASWIDTH;
    *flagp |= flags & SPSTART;
  }

  // Make a closing node, and hook it on the end.
  ender = regnode(static_cast<char>((paren) ? CLOSE + parno : END));
  regtail(ret, ender);

  // Hook the tails of the branches to the closing node.
  for (br = ret; br != KWSYS_NULLPTR; br = regnext(br))
    regoptail(br, ender);

  // Check for proper termination.
  if (paren && *regparse++ != ')') {
    // RAISE Error, SYM(RegularExpression), SYM(Unmatched_Parens),
    printf("RegularExpression::compile(): Unmatched parentheses.\n");
    return KWSYS_NULLPTR;
  } else if (!paren && *regparse != '\0') {
    if (*regparse == ')') {
      // RAISE Error, SYM(RegularExpression), SYM(Unmatched_Parens),
      printf("RegularExpression::compile(): Unmatched parentheses.\n");
      return KWSYS_NULLPTR;
    } else {
      // RAISE Error, SYM(RegularExpression), SYM(Internal_Error),
      printf("RegularExpression::compile(): Internal error.\n");
      return KWSYS_NULLPTR;
    }
    // NOTREACHED
  }
  return (ret);
}